

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O1

void Abc_NodeMffcConeSupp(Abc_Obj_t *pNode,Vec_Ptr_t *vCone,Vec_Ptr_t *vSupp)

{
  ulong uVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  int *piVar4;
  int iVar5;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcRefs.c"
                  ,0x12d,"void Abc_NodeMffcConeSupp(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcRefs.c"
                  ,0x12e,"void Abc_NodeMffcConeSupp(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (vCone != (Vec_Ptr_t *)0x0) {
    vCone->nSize = 0;
  }
  if (vSupp != (Vec_Ptr_t *)0x0) {
    vSupp->nSize = 0;
  }
  pAVar3 = pNode->pNtk;
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar2 = pAVar3->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar5 = (int)uVar1;
    if ((pAVar3->vTravIds).nCap < iVar5) {
      piVar4 = (int *)malloc(uVar1 * 4);
      (pAVar3->vTravIds).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar3->vTravIds).nCap = iVar5;
    }
    if (-500 < iVar2) {
      memset((pAVar3->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pAVar3->vTravIds).nSize = iVar5;
  }
  iVar2 = pAVar3->nTravIds;
  pAVar3->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    Abc_NodeMffcConeSupp_rec(pNode,vCone,vSupp,1);
    return;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

void Abc_NodeMffcConeSupp( Abc_Obj_t * pNode, Vec_Ptr_t * vCone, Vec_Ptr_t * vSupp )
{
    assert( Abc_ObjIsNode(pNode) );
    assert( !Abc_ObjIsComplement(pNode) );
    if ( vCone ) Vec_PtrClear( vCone );
    if ( vSupp ) Vec_PtrClear( vSupp );
    Abc_NtkIncrementTravId( pNode->pNtk );
    Abc_NodeMffcConeSupp_rec( pNode, vCone, vSupp, 1 );
//    printf( "\n" );
}